

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int nettlp_run_cb(nettlp **nt,int nnts,nettlp_cb *cb,void *arg)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  int *piVar4;
  ssize_t sVar5;
  void *pvVar6;
  undefined8 in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  tlp_cpl_hdr *ch;
  tlp_mr_hdr *mh;
  tlp_hdr *th;
  nettlp_hdr *nh;
  char buf [4096];
  pollfd x [16];
  ssize_t received;
  int n;
  int ret;
  tlp_cpl_hdr *ch_00;
  tlp_cpl_hdr *in_stack_ffffffffffffeef0;
  tlp_cpl_hdr *ch_01;
  undefined1 local_10b8 [6];
  tlp_cpl_hdr local_10b2 [340];
  pollfd local_b8 [17];
  int local_30;
  int local_2c;
  undefined8 local_28;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_2c = 0;
  if (in_ESI < 0x11) {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    for (local_30 = 0; local_30 < local_14; local_30 = local_30 + 1) {
      local_b8[local_30].fd = *(int *)(*(long *)(local_10 + (long)local_30 * 8) + 0x10);
      local_b8[local_30].events = 1;
    }
LAB_0010283e:
    if (stop_flag == 0) {
      local_2c = poll(local_b8,(long)local_14,500);
      if (local_2c < 0) goto LAB_00102ba4;
      if (local_2c != 0) {
        for (local_30 = 0; local_30 < local_14; local_30 = local_30 + 1) {
          if ((local_b8[local_30].revents & 1U) != 0) {
            sVar5 = read(*(int *)(*(long *)(local_10 + (long)local_30 * 8) + 0x10),local_10b8,0x1000
                        );
            local_2c = (int)sVar5;
            if ((int)sVar5 < 0) break;
            ch_01 = local_10b2;
            if ((((local_10b2[0].tlp.fmt_type & 0x1f) == 0) &&
                ((local_10b2[0].tlp.fmt_type & 0x40) == 0)) && (*(long *)(local_20 + 0x10) != 0)) {
              (**(code **)(local_20 + 0x10))
                        (*(undefined8 *)(local_10 + (long)local_30 * 8),ch_01,local_28);
            }
            else if ((((local_10b2[0].tlp.fmt_type & 0x1f) == 0) &&
                     ((local_10b2[0].tlp.fmt_type & 0x40) == 0x40)) &&
                    (*(long *)(local_20 + 0x18) != 0)) {
              pcVar1 = *(code **)(local_20 + 0x18);
              uVar2 = *(undefined8 *)(local_10 + (long)local_30 * 8);
              pvVar6 = tlp_mwr_data((tlp_mr_hdr *)ch_01);
              iVar3 = tlp_mr_data_length((tlp_mr_hdr *)in_stack_ffffffffffffeef0);
              (*pcVar1)(uVar2,ch_01,pvVar6,(long)iVar3,local_28);
            }
            else if ((((local_10b2[0].tlp.fmt_type & 0x1f) == 10) &&
                     ((local_10b2[0].tlp.fmt_type & 0x40) == 0)) &&
                    (*(long *)(local_20 + 0x20) != 0)) {
              (**(code **)(local_20 + 0x20))
                        (*(undefined8 *)(local_10 + (long)local_30 * 8),ch_01,local_28);
            }
            else if ((((local_10b2[0].tlp.fmt_type & 0x1f) == 10) &&
                     ((local_10b2[0].tlp.fmt_type & 0x40) == 0x40)) &&
                    (*(long *)(local_20 + 0x28) != 0)) {
              pcVar1 = *(code **)(local_20 + 0x28);
              ch_00 = *(tlp_cpl_hdr **)(local_10 + (long)local_30 * 8);
              pvVar6 = tlp_cpld_data(ch_01);
              iVar3 = tlp_cpld_data_length(ch_00);
              (*pcVar1)(ch_00,ch_01,pvVar6,(long)iVar3,local_28);
              in_stack_ffffffffffffeef0 = ch_01;
            }
            else if (*(long *)(local_20 + 0x30) != 0) {
              (**(code **)(local_20 + 0x30))
                        (*(undefined8 *)(local_10 + (long)local_30 * 8),ch_01,local_28);
            }
          }
        }
      }
      goto LAB_0010283e;
    }
LAB_00102ba4:
    local_4 = local_2c;
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = -0x16;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int nettlp_run_cb(struct nettlp **nt, int nnts,
		  struct nettlp_cb *cb, void *arg)
{
	int ret = 0, n;
	ssize_t received;
	struct pollfd x[NETTLP_CB_MAX_NTS];
	char buf[4096];
	struct nettlp_hdr *nh;
	struct tlp_hdr *th;
	struct tlp_mr_hdr *mh;
	struct tlp_cpl_hdr *ch;

	if (nnts > NETTLP_CB_MAX_NTS) {
		errno = -EINVAL;
		return -1;
	}

	for (n = 0; n < nnts; n++) {
		x[n].fd = nt[n]->sockfd;
		x[n].events = POLLIN;
	}

	while (1) {

		if (stop_flag)
			break;

		ret = poll(x, nnts, LIBTLP_CPL_TIMEOUT);
		if (ret < 0)
			break;

		if (ret == 0)
			continue;	/* timeout */

		for (n = 0; n < nnts; n++) {

			if (!(x[n].revents & POLLIN))
				continue;

			ret = read(nt[n]->sockfd, buf, sizeof(buf));
			if (ret < 0)
				break;

			nh = (struct nettlp_hdr *)buf;
			th = (struct tlp_hdr *)(nh + 1);
			mh = (struct tlp_mr_hdr *)th;
			ch = (struct tlp_cpl_hdr *)th;

			if (tlp_is_mrd(th->fmt_type) && cb->mrd) {
				cb->mrd(nt[n], mh, arg);
			} else if (tlp_is_mwr(th->fmt_type) && cb->mwr) {

				cb->mwr(nt[n], mh, tlp_mwr_data(mh),
					tlp_mr_data_length(mh), arg);

			} else if (tlp_is_cpl(th->fmt_type) &&
				   tlp_is_wo_data(th->fmt_type) && cb->cpl) {

				cb->cpl(nt[n], ch, arg);

			} else if (tlp_is_cpl(th->fmt_type) &&
				   tlp_is_w_data(th->fmt_type) && cb->cpld) {

				cb->cpld(nt[n], ch, tlp_cpld_data(ch),
					 tlp_cpld_data_length(ch), arg);
			} else if (cb->other) {
				cb->other(nt[n], th, arg);
			}
		}
	}

	return ret;
}